

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

bool COST_SENSITIVE::test_label(void *v)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  label *ld;
  ulong uVar5;
  
  lVar3 = *(long *)((long)v + 8) - *v;
  if (lVar3 == 0) {
    return true;
  }
  uVar4 = 1;
  uVar5 = 0;
  while( true ) {
    fVar1 = *(float *)(*v + uVar5 * 0x10);
    bVar2 = (bool)(-(fVar1 == 3.4028235e+38) & 1);
    if (fVar1 != 3.4028235e+38) {
      return bVar2;
    }
    if (NAN(fVar1)) break;
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
    if ((ulong)(lVar3 >> 4) <= uVar5) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

inline size_t size() const { return _end - _begin; }